

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O1

void __thiscall HTTP::Tick(HTTP *this,double timeout)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  string local_38;
  
  bVar1 = Client::Select(this->client,timeout);
  if (bVar1) {
    Client::Recv_abi_cxx11_(&local_38,this->client,0x2000);
    std::__cxx11::string::_M_append((char *)&this->response,(ulong)local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = Client::Connected(this->client);
  if (!bVar1) {
    this_00 = &this->response;
    if (0xc < (this->response)._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)this_00);
      iVar2 = util::to_int(&local_38);
      this->status = iVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    lVar3 = std::__cxx11::string::find((char *)this_00,0x1a8a74,0);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->response)._M_string_length,0x1a58fd);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    this->done = true;
  }
  return;
}

Assistant:

void HTTP::Tick(double timeout)
{
	if (this->client->Select(timeout))
	{
		this->response += this->client->Recv(8192);
	}

	if (!this->client->Connected())
	{
		if (this->response.length() > 12)
		{
			this->status = util::to_int(this->response.substr(9,3));
		}

		std::size_t startcontent = this->response.find("\r\n\r\n");

		if (startcontent == std::string::npos)
		{
			this->response = "";
		}
		else
		{
			this->response = this->response.substr(startcontent+4);
		}

		this->done = true;
	}
}